

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall duckdb::SQLLogicTestLogger::PrintSQLFormatted(SQLLogicTestLogger *this)

{
  ostream *poVar1;
  void *this_00;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  long in_RDI;
  idx_t next;
  value_type *token;
  idx_t i;
  vector<duckdb::SimplifiedToken,_true> tokens;
  void *in_stack_ffffffffffffff58;
  vector<duckdb::SimplifiedToken,_true> *in_stack_ffffffffffffff60;
  idx_t local_98;
  string local_68 [32];
  idx_t local_48;
  reference local_30;
  ulong local_28;
  string local_20 [32];
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,termcolor::bold);
  poVar1 = std::operator<<(poVar1,"SQL Query");
  this_00 = (void *)std::ostream::operator<<(poVar1,termcolor::reset);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  duckdb::Parser::Tokenize(local_20);
  for (local_28 = 0; uVar3 = local_28,
      sVar2 = std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::size
                        ((vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                          *)local_20), uVar3 < sVar2; local_28 = local_28 + 1) {
    local_30 = vector<duckdb::SimplifiedToken,_true>::operator[]
                         (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    uVar3 = local_28 + 1;
    sVar2 = std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::size
                      ((vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_> *)
                       local_20);
    if (uVar3 < sVar2) {
      pvVar4 = vector<duckdb::SimplifiedToken,_true>::operator[]
                         (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      local_98 = pvVar4->start;
    }
    else {
      local_98 = std::__cxx11::string::size();
    }
    local_48 = local_98;
    in_stack_ffffffffffffff60 = (vector<duckdb::SimplifiedToken,_true> *)(ulong)local_30->type;
    switch(in_stack_ffffffffffffff60) {
    case (vector<duckdb::SimplifiedToken,_true> *)0x0:
    case (vector<duckdb::SimplifiedToken,_true> *)0x6:
      break;
    case (vector<duckdb::SimplifiedToken,_true> *)0x1:
    case (vector<duckdb::SimplifiedToken,_true> *)0x2:
      std::ostream::operator<<(&std::cerr,termcolor::yellow);
      break;
    case (vector<duckdb::SimplifiedToken,_true> *)0x3:
      break;
    case (vector<duckdb::SimplifiedToken,_true> *)0x4:
      in_stack_ffffffffffffff58 = (void *)std::ostream::operator<<(&std::cerr,termcolor::green);
      std::ostream::operator<<(in_stack_ffffffffffffff58,termcolor::bold);
      break;
    case (vector<duckdb::SimplifiedToken,_true> *)0x5:
      std::ostream::operator<<(&std::cerr,termcolor::grey);
    }
    std::__cxx11::string::substr((ulong)local_68,in_RDI + 0x30);
    std::operator<<((ostream *)&std::cerr,local_68);
    std::__cxx11::string::~string(local_68);
    std::ostream::operator<<(&std::cerr,termcolor::reset);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  vector<duckdb::SimplifiedToken,_true>::~vector((vector<duckdb::SimplifiedToken,_true> *)0x7c5783);
  return;
}

Assistant:

void SQLLogicTestLogger::PrintSQLFormatted() {
	std::cerr << termcolor::bold << "SQL Query" << termcolor::reset << std::endl;
	auto tokens = Parser::Tokenize(sql_query);
	for (idx_t i = 0; i < tokens.size(); i++) {
		auto &token = tokens[i];
		idx_t next = i + 1 < tokens.size() ? tokens[i + 1].start : sql_query.size();
		// adjust the highlighting based on the type
		switch (token.type) {
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_IDENTIFIER:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_ERROR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_NUMERIC_CONSTANT:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_STRING_CONSTANT:
			std::cerr << termcolor::yellow;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_OPERATOR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_KEYWORD:
			std::cerr << termcolor::green << termcolor::bold;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_COMMENT:
			std::cerr << termcolor::grey;
			break;
		}
		// print the current token
		std::cerr << sql_query.substr(token.start, next - token.start);
		// reset and move to the next token
		std::cerr << termcolor::reset;
	}
	std::cerr << std::endl;
}